

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

Node * __thiscall Parser::paren_expression(Node *__return_storage_ptr__,Parser *this)

{
  lexemtype lVar1;
  ostream *poVar2;
  Node local_70;
  undefined1 local_19;
  Parser *local_18;
  Parser *this_local;
  Node *parenExpNode;
  
  local_19 = 0;
  local_18 = this;
  this_local = (Parser *)__return_storage_ptr__;
  Node::Node(__return_storage_ptr__);
  lVar1 = getLexemType(this);
  if (lVar1 != OPAR) {
    poVar2 = std::operator<<((ostream *)&std::cout,"\"(\" expected");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    exit(0);
  }
  nextLexem(this);
  expression(&local_70,this);
  Node::operator=(__return_storage_ptr__,&local_70);
  Node::~Node(&local_70);
  lVar1 = getLexemType(this);
  if (lVar1 == CPAR) {
    nextLexem(this);
    return __return_storage_ptr__;
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"\")\" expected");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  exit(0);
}

Assistant:

Node Parser::paren_expression() {
    Node parenExpNode;
    if (getLexemType() != OPAR) {
        cout << "\"(\" expected" << endl;
        exit(0);
    }
    nextLexem();
    parenExpNode = expression();
    if (getLexemType() != CPAR) {
        cout << "\")\" expected" << endl;
        exit(0);
    }
    nextLexem();
    return parenExpNode;
}